

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.cc
# Opt level: O3

bool __thiscall
draco::AttributesDecoder::DecodeAttributesDecoderData
          (AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  byte num_components;
  char cVar5;
  ushort uVar6;
  long lVar7;
  char *pcVar8;
  uint32_t uVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  AttributesDecoder *pAVar11;
  bool bVar12;
  int32_t iVar13;
  int iVar14;
  ulong uVar15;
  tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> this_00;
  pointer piVar16;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> local_b0;
  uint32_t unique_id;
  value_type_conflict1 local_a0;
  uint local_9c;
  PointCloud *local_98;
  ulong local_90;
  vector<int,_std::allocator<int>_> *local_88;
  ulong local_80;
  AttributesDecoder *local_78;
  GeometryAttribute local_70;
  
  if (this->point_cloud_decoder_->version_major_ < 2) {
    lVar1 = in_buffer->pos_ + 4;
    if (in_buffer->data_size_ < lVar1) {
      return false;
    }
    local_9c = *(uint *)(in_buffer->data_ + in_buffer->pos_);
    in_buffer->pos_ = lVar1;
  }
  else {
    bVar12 = anon_unknown_13::DecodeVarintUnsigned<unsigned_int>(1,&local_9c,in_buffer);
    if (!bVar12) {
      return false;
    }
  }
  uVar15 = (ulong)local_9c;
  if ((local_9c != 0) && ((long)uVar15 <= (in_buffer->data_size_ - in_buffer->pos_) * 5)) {
    std::vector<int,_std::allocator<int>_>::resize(&this->point_attribute_ids_,uVar15);
    local_98 = this->point_cloud_;
    local_88 = &this->point_attribute_to_local_id_map_;
    local_90 = 0;
    local_80 = uVar15;
    local_78 = this;
    while( true ) {
      lVar1 = in_buffer->data_size_;
      lVar7 = in_buffer->pos_;
      if (lVar1 < lVar7 + 1) break;
      pcVar8 = in_buffer->data_;
      bVar3 = pcVar8[lVar7];
      in_buffer->pos_ = lVar7 + 1;
      if (lVar1 < lVar7 + 2) {
        return false;
      }
      bVar4 = pcVar8[lVar7 + 1];
      in_buffer->pos_ = lVar7 + 2;
      lVar2 = lVar7 + 3;
      if (lVar1 < lVar2) {
        return false;
      }
      num_components = pcVar8[lVar7 + 2];
      in_buffer->pos_ = lVar2;
      if (lVar1 < lVar7 + 4) {
        return false;
      }
      cVar5 = pcVar8[lVar2];
      in_buffer->pos_ = lVar7 + 4;
      if (4 < bVar3) {
        return false;
      }
      if ((byte)(bVar4 - 0xc) < 0xf5) {
        return false;
      }
      if (num_components == 0) {
        return false;
      }
      GeometryAttribute::GeometryAttribute(&local_70);
      iVar13 = DataTypeLength((uint)bVar4);
      GeometryAttribute::Init
                (&local_70,(uint)bVar3,(DataBuffer *)0x0,num_components,(uint)bVar4,cVar5 != '\0',
                 (long)iVar13 * (ulong)num_components,0);
      pAVar11 = local_78;
      uVar6._0_1_ = local_78->point_cloud_decoder_->version_major_;
      uVar6._1_1_ = local_78->point_cloud_decoder_->version_minor_;
      if ((ushort)(uVar6 << 8 | uVar6 >> 8) < 0x103) {
        lVar1 = in_buffer->pos_ + 2;
        if (in_buffer->data_size_ < lVar1) {
          return false;
        }
        uVar6 = *(ushort *)(in_buffer->data_ + in_buffer->pos_);
        in_buffer->pos_ = lVar1;
        unique_id = (uint32_t)uVar6;
      }
      else {
        bVar12 = anon_unknown_13::DecodeVarintUnsigned<unsigned_int>(1,&unique_id,in_buffer);
        if (!bVar12) {
          return false;
        }
      }
      uVar9 = unique_id;
      local_70.unique_id_ = unique_id;
      this_00.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           operator_new(0x70);
      PointAttribute::PointAttribute
                ((PointAttribute *)
                 this_00.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,&local_70);
      uVar15 = local_90;
      local_b0._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           this_00.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      iVar14 = PointCloud::AddAttribute
                         (local_98,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                    *)&local_b0);
      if ((_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
          local_b0._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl !=
          (PointAttribute *)0x0) {
        std::default_delete<draco::PointAttribute>::operator()
                  ((default_delete<draco::PointAttribute> *)&local_b0,
                   (PointAttribute *)
                   local_b0._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      }
      pvVar10 = local_88;
      local_b0._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           0x0;
      *(uint32_t *)
       ((long)(local_98->attributes_).
              super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar14]._M_t.
              super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
              ._M_t + 0x3c) = uVar9;
      (pAVar11->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = iVar14;
      piVar16 = (pAVar11->point_attribute_to_local_id_map_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if ((int)((ulong)((long)(pAVar11->point_attribute_to_local_id_map_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar16) >> 2) <= iVar14) {
        local_a0 = -1;
        std::vector<int,_std::allocator<int>_>::resize(local_88,(long)(iVar14 + 1),&local_a0);
        piVar16 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      piVar16[iVar14] = (int)uVar15;
      local_90 = uVar15 + 1;
      if (local_80 == local_90) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AttributesDecoder::DecodeAttributesDecoderData(DecoderBuffer *in_buffer) {
  // Decode and create attributes.
  uint32_t num_attributes;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (point_cloud_decoder_->bitstream_version() <
      DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!in_buffer->Decode(&num_attributes)) {
      return false;
    }
  } else
#endif
  {
    if (!DecodeVarint(&num_attributes, in_buffer)) {
      return false;
    }
  }

  // Check that decoded number of attributes is valid.
  if (num_attributes == 0) {
    return false;
  }
  if (num_attributes > 5 * in_buffer->remaining_size()) {
    // The decoded number of attributes is unreasonably high, because at least
    // five bytes of attribute descriptor data per attribute are expected.
    return false;
  }

  // Decode attribute descriptor data.
  point_attribute_ids_.resize(num_attributes);
  PointCloud *pc = point_cloud_;
  for (uint32_t i = 0; i < num_attributes; ++i) {
    // Decode attribute descriptor data.
    uint8_t att_type, data_type, num_components, normalized;
    if (!in_buffer->Decode(&att_type)) {
      return false;
    }
    if (!in_buffer->Decode(&data_type)) {
      return false;
    }
    if (!in_buffer->Decode(&num_components)) {
      return false;
    }
    if (!in_buffer->Decode(&normalized)) {
      return false;
    }
    if (att_type >= GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
      return false;
    }
    if (data_type == DT_INVALID || data_type >= DT_TYPES_COUNT) {
      return false;
    }

    // Check decoded attribute descriptor data.
    if (num_components == 0) {
      return false;
    }

    // Add the attribute to the point cloud.
    const DataType draco_dt = static_cast<DataType>(data_type);
    GeometryAttribute ga;
    ga.Init(static_cast<GeometryAttribute::Type>(att_type), nullptr,
            num_components, draco_dt, normalized > 0,
            DataTypeLength(draco_dt) * num_components, 0);
    uint32_t unique_id;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (point_cloud_decoder_->bitstream_version() <
        DRACO_BITSTREAM_VERSION(1, 3)) {
      uint16_t custom_id;
      if (!in_buffer->Decode(&custom_id)) {
        return false;
      }
      // TODO(draco-eng): Add "custom_id" to attribute metadata.
      unique_id = static_cast<uint32_t>(custom_id);
      ga.set_unique_id(unique_id);
    } else
#endif
    {
      if (!DecodeVarint(&unique_id, in_buffer)) {
        return false;
      }
      ga.set_unique_id(unique_id);
    }
    const int att_id = pc->AddAttribute(
        std::unique_ptr<PointAttribute>(new PointAttribute(ga)));
    pc->attribute(att_id)->set_unique_id(unique_id);
    point_attribute_ids_[i] = att_id;

    // Update the inverse map.
    if (att_id >=
        static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(att_id + 1, -1);
    }
    point_attribute_to_local_id_map_[att_id] = i;
  }
  return true;
}